

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void __thiscall
sensors_analytics::utils::ObjectNode::ValueNode::ValueNode(ValueNode *this,ObjectNode *value)

{
  ObjectNode *value_local;
  ValueNode *this_local;
  
  this->node_type_ = OBJECT;
  UnionValue::UnionValue((UnionValue *)&(this->value_).date_time_value);
  std::__cxx11::string::string((string *)&this->string_data_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->list_data_);
  ObjectNode(&this->object_data_);
  ObjectNode::operator=(&this->object_data_,value);
  return;
}

Assistant:

utils::ObjectNode::ValueNode::ValueNode(const utils::ObjectNode &value)
    : node_type_(OBJECT) {
  object_data_ = value;
}